

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

void __thiscall AbstractTransaction_TxArray_Test::TestBody(AbstractTransaction_TxArray_Test *this)

{
  bool bVar1;
  AbstractTransaction **in_RSI;
  iterator iVar2;
  vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
  vector_info;
  TestTransaction tx;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  void *local_38;
  iterator iStack_30;
  AbstractTransaction **local_28;
  AbstractTransaction local_18;
  
  iVar2._M_current = (AbstractTransaction **)&local_48;
  local_38 = (void *)0x0;
  iStack_30._M_current = (AbstractTransaction **)0x0;
  local_28 = (AbstractTransaction **)0x0;
  TestTransaction::TestTransaction((TestTransaction *)&local_18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    iVar2._M_current = in_RSI;
    if (bVar1) {
      iVar2._M_current = iStack_30._M_current;
      local_48.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_18;
      if (iStack_30._M_current == local_28) {
        std::vector<cfd::core::AbstractTransaction*,std::allocator<cfd::core::AbstractTransaction*>>
        ::_M_realloc_insert<cfd::core::AbstractTransaction*>
                  ((vector<cfd::core::AbstractTransaction*,std::allocator<cfd::core::AbstractTransaction*>>
                    *)&local_38,iStack_30,(AbstractTransaction **)&local_48);
      }
      else {
        *iStack_30._M_current = &local_18;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x145,
               "Expected: (vector_info.push_back(&tx)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((AbstractTransaction *)local_48.ptr_ != (AbstractTransaction *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AbstractTransaction *)local_48.ptr_ != (AbstractTransaction *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  local_18._vptr_AbstractTransaction = (_func_int **)&PTR__AbstractTransaction_006a6598;
  cfd::core::AbstractTransaction::FreeWallyAddress
            ((AbstractTransaction *)local_18.wally_tx_pointer_,iVar2._M_current);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxIn_RemoveTxIn) {
  uint32_t txin_count = 2;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
          vout, seq,
          Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac")));

  // script is empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597"),
          vout, seq, Script()));

  std::vector<TxInReference> list = tx.GetTxInList();
  EXPECT_STREQ(
      list[0].GetTxid().GetHex().c_str(),
      "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6");
  EXPECT_STREQ(list[0].GetUnlockingScript().GetHex().c_str(),
               "76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac");
  EXPECT_EQ(list[0].GetVout(), vout);
  EXPECT_EQ(list[0].GetSequence(), seq);
  EXPECT_EQ(tx.GetTxInCount(), txin_count);

  // index error
  EXPECT_THROW(tx.RemoveTxIn(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  txin_count--;
  EXPECT_EQ(tx.GetTxInCount(), txin_count);
}